

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::DescriptorProto_ReservedRange::_InternalParse
          (DescriptorProto_ReservedRange *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  char cVar4;
  uint32 uVar5;
  UnknownFieldSet *unknown;
  byte *p;
  uint uVar6;
  uint res;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar6 = 0;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) goto LAB_00299f5a;
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar7 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar7.first;
        res = pVar7.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
      cVar4 = '\x04';
    }
    else {
      if (res >> 3 == 2) {
        if ((char)res != '\x10') goto LAB_00299e90;
        bVar1 = *p;
        pVar9.second = (long)(char)bVar1;
        pVar9.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar5 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar9 = internal::VarintParseSlow64((char *)p,uVar5);
          }
          else {
            pVar9.second._0_4_ = uVar5;
            pVar9.first = (char *)(p + 2);
            pVar9.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar9.first;
        }
        uVar6 = uVar6 | 2;
        this->end_ = (int32)pVar9.second;
      }
      else {
        if ((res >> 3 != 1) || ((char)res != '\b')) {
LAB_00299e90:
          if (res == 0 || (res & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
            cVar4 = '\a';
          }
          else {
            pvVar2 = this_00->ptr_;
            if (((ulong)pvVar2 & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
            cVar4 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
          }
          goto LAB_00299f2a;
        }
        bVar1 = *p;
        pVar8.second = (long)(char)bVar1;
        pVar8.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar5 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar8 = internal::VarintParseSlow64((char *)p,uVar5);
          }
          else {
            pVar8.second._0_4_ = uVar5;
            pVar8.first = (char *)(p + 2);
            pVar8.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar8.first;
        }
        uVar6 = uVar6 | 1;
        this->start_ = (int32)pVar8.second;
      }
      cVar4 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_00299f2a:
  } while (cVar4 == '\x02');
  if (cVar4 == '\x04') {
    local_38 = (byte *)0x0;
  }
LAB_00299f5a:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar6;
  return (char *)local_38;
}

Assistant:

const char* DescriptorProto_ReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}